

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::mulew(Matrix *this,Matrix *mat)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = (this->m_shape).field_0.m_dims[0];
  if ((uVar9 == (mat->m_shape).field_0.m_dims[0]) &&
     (uVar1 = (this->m_shape).field_0.m_dims[1], uVar8 = (ulong)uVar1,
     uVar1 == (mat->m_shape).field_0.m_dims[1])) {
    if (uVar9 != 0) {
      pvVar2 = (mat->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (this->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = 0;
      do {
        iVar7 = (int)uVar8;
        uVar8 = 0;
        if (iVar7 != 0) {
          lVar4 = *(long *)&pvVar2[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          lVar5 = *(long *)&pvVar3[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          uVar10 = 0;
          do {
            *(double *)(lVar5 + uVar10 * 8) =
                 *(double *)(lVar4 + uVar10 * 8) * *(double *)(lVar5 + uVar10 * 8);
            uVar10 = uVar10 + 1;
            uVar8 = (ulong)(this->m_shape).field_0.m_dims[1];
          } while (uVar10 < uVar8);
          uVar9 = (this->m_shape).field_0.m_dims[0];
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar9);
    }
    return this;
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR [element-wise multiplication]: Shapes don\'t match!\n");
  exit(1);
}

Assistant:

Matrix& Matrix::mulew(const Matrix& mat){
    if(m_shape!=mat.m_shape){
        std::cout<<"ERROR [element-wise multiplication]: Shapes don't match!\n";
        exit(1);
    }

    for(uint i=0;i<m_shape.n_row;++i){
        for(uint j=0;j<m_shape.n_col;++j){
            m_vals[i][j]*=mat.m_vals[i][j];
        }
    }
    return *this;
}